

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  int *piVar4;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  ImFontAtlas *pIVar7;
  char *pcVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int n;
  ImGuiID IVar17;
  ImGuiInputSource IVar18;
  int iVar19;
  ImFont **ppIVar20;
  long lVar21;
  ImFont *font;
  ImGuiWindow *pIVar22;
  ImGuiPopupData *pIVar23;
  ImGuiWindow **ppIVar24;
  int i_1;
  ImGuiID IVar25;
  ImGuiWindow *window;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar26;
  ImGuiNavDirSourceFlags dir_sources;
  ImGuiNavMoveResult *pIVar27;
  byte bVar28;
  int i_2;
  int i;
  float *pfVar29;
  ImGuiNavLayer IVar30;
  float *pfVar31;
  ImGuiWindow *old_nav_window;
  bool *pbVar32;
  byte bVar33;
  uint uVar34;
  uint uVar35;
  float fVar36;
  ImVec2 IVar37;
  ImVec2 IVar38;
  ImVec2 IVar39;
  ImVec2 IVar40;
  ImVec2 IVar41;
  ImVec2 IVar42;
  ImVec2 IVar44;
  double dVar43;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  float fVar54;
  float local_80;
  ImRect rect_abs;
  ImVec2 delta_scroll;
  ImRect local_40;
  
  pIVar11 = GImGui;
  bVar33 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd61,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6a,"void ImGui::NewFrame()");
  }
  iVar19 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar19 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd6b,"void ImGui::NewFrame()");
    }
  }
  else if ((iVar19 != 0) && (GImGui->FrameCountEnded != iVar19)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6c,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6d,"void ImGui::NewFrame()");
  }
  pIVar7 = (GImGui->IO).Fonts;
  if ((pIVar7->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6e,"void ImGui::NewFrame()");
  }
  ppIVar20 = ImVector<ImFont_*>::operator[](&pIVar7->Fonts,0);
  if ((*ppIVar20)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6f,"void ImGui::NewFrame()");
  }
  if ((pIVar11->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd70,"void ImGui::NewFrame()");
  }
  fVar52 = (pIVar11->Style).Alpha;
  if ((fVar52 < 0.0) || (1.0 < fVar52)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd71,"void ImGui::NewFrame()");
  }
  if (((pIVar11->Style).WindowMinSize.x < 1.0) || ((pIVar11->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd72,"void ImGui::NewFrame()");
  }
  lVar21 = 0;
  while (lVar21 != 0x15) {
    piVar4 = (pIVar11->IO).KeyMap + lVar21;
    lVar21 = lVar21 + 1;
    if (0x200 < *piVar4 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd74,"void ImGui::NewFrame()");
    }
  }
  if ((((pIVar11->IO).ConfigFlags & 1) != 0) && ((pIVar11->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd78,"void ImGui::NewFrame()");
  }
  if (((pIVar11->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar11->IO).BackendFlags & 2) == 0)) {
    (pIVar11->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar11->SettingsLoaded == false) {
    if ((pIVar11->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd81,"void ImGui::NewFrame()");
    }
    pcVar8 = (pIVar11->IO).IniFilename;
    if (pcVar8 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar8);
    }
    pIVar11->SettingsLoaded = true;
  }
  fVar52 = (pIVar11->IO).DeltaTime;
  if ((0.0 < pIVar11->SettingsDirtyTimer) &&
     (fVar46 = pIVar11->SettingsDirtyTimer - fVar52, pIVar11->SettingsDirtyTimer = fVar46,
     fVar46 <= 0.0)) {
    pcVar8 = (pIVar11->IO).IniFilename;
    if (pcVar8 == (char *)0x0) {
      (pIVar11->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar8);
      fVar52 = (pIVar11->IO).DeltaTime;
    }
    pIVar11->SettingsDirtyTimer = 0.0;
  }
  pIVar11->Time = (double)fVar52 + pIVar11->Time;
  pIVar11->FrameScopeActive = true;
  pIVar11->FrameCount = pIVar11->FrameCount + 1;
  pIVar11->TooltipOverrideCount = 0;
  pIVar11->WindowsActiveCount = 0;
  ((pIVar11->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar11->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd9e,"void ImGui::NewFrame()");
  }
  fVar52 = (pIVar11->IO).DisplaySize.x;
  fVar46 = (pIVar11->IO).DisplaySize.y;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.z = fVar52;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.w = fVar46;
  (pIVar11->DrawListSharedData).CurveTessellationTol = (pIVar11->Style).CurveTessellationTol;
  pIVar1 = &pIVar11->BackgroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar11->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar11->BackgroundDrawList).Flags =
       (uint)(pIVar11->Style).AntiAliasedLines + (uint)(pIVar11->Style).AntiAliasedFill * 2;
  pIVar1 = &pIVar11->ForegroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar11->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar11->ForegroundDrawList).Flags =
       (uint)(pIVar11->Style).AntiAliasedLines + (uint)(pIVar11->Style).AntiAliasedFill * 2;
  (pIVar11->DrawData).Valid = false;
  (pIVar11->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar11->DrawData).CmdListsCount = 0;
  (pIVar11->DrawData).TotalIdxCount = 0;
  (pIVar11->DrawData).TotalVtxCount = 0;
  (pIVar11->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar11->DrawData).DisplayPos.y = 0;
  (pIVar11->DrawData).DisplaySize.x = 0.0;
  (pIVar11->DrawData).DisplaySize.y = 0.0;
  (pIVar11->DrawData).FramebufferScale.x = 0.0;
  (pIVar11->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar11->DragDropActive == true) &&
     (IVar25 = (pIVar11->DragDropPayload).SourceId, IVar25 == pIVar11->ActiveId)) {
    KeepAliveID(IVar25);
  }
  if (pIVar11->HoveredIdPreviousFrame == 0) {
    IVar25 = pIVar11->HoveredId;
    pIVar11->HoveredIdTimer = 0.0;
    pIVar11->HoveredIdNotActiveTimer = 0.0;
    if (IVar25 != 0) goto LAB_001198ed;
LAB_00119918:
    IVar25 = 0;
    IVar17 = pIVar11->ActiveId;
  }
  else {
    IVar25 = pIVar11->HoveredId;
    if (IVar25 == 0) goto LAB_00119918;
    if (pIVar11->ActiveId == IVar25) {
      pIVar11->HoveredIdNotActiveTimer = 0.0;
    }
LAB_001198ed:
    fVar52 = (pIVar11->IO).DeltaTime;
    pIVar11->HoveredIdTimer = pIVar11->HoveredIdTimer + fVar52;
    IVar17 = IVar25;
    if (pIVar11->ActiveId != IVar25) {
      pIVar11->HoveredIdNotActiveTimer = fVar52 + pIVar11->HoveredIdNotActiveTimer;
      IVar17 = pIVar11->ActiveId;
    }
  }
  pIVar11->HoveredIdPreviousFrame = IVar25;
  pIVar11->HoveredId = 0;
  pIVar11->HoveredIdAllowOverlap = false;
  if (((pIVar11->ActiveIdIsAlive != IVar17) && (IVar17 != 0)) &&
     (pIVar11->ActiveIdPreviousFrame == IVar17)) {
    ClearActiveID();
    IVar17 = pIVar11->ActiveId;
  }
  fVar52 = (pIVar11->IO).DeltaTime;
  if (IVar17 != 0) {
    pIVar11->ActiveIdTimer = pIVar11->ActiveIdTimer + fVar52;
  }
  pIVar11->LastActiveIdTimer = pIVar11->LastActiveIdTimer + fVar52;
  pIVar11->ActiveIdPreviousFrame = IVar17;
  pIVar11->ActiveIdPreviousFrameWindow = pIVar11->ActiveIdWindow;
  pIVar11->ActiveIdPreviousFrameHasBeenEdited = pIVar11->ActiveIdHasBeenEdited;
  pIVar11->ActiveIdIsAlive = 0;
  pIVar11->ActiveIdPreviousFrameIsAlive = false;
  pIVar11->ActiveIdIsJustActivated = false;
  if ((pIVar11->TempInputTextId != 0) && (IVar17 != pIVar11->TempInputTextId)) {
    pIVar11->TempInputTextId = 0;
  }
  pIVar11->DragDropAcceptIdPrev = pIVar11->DragDropAcceptIdCurr;
  pIVar11->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar11->DragDropAcceptIdCurr = 0;
  pIVar11->DragDropWithinSourceOrTarget = false;
  pfVar2 = (pIVar11->IO).KeysDownDuration;
  memcpy((pIVar11->IO).KeysDownDurationPrev,pfVar2,0x800);
  for (lVar21 = 0; pIVar12 = GImGui, lVar21 != 0x200; lVar21 = lVar21 + 1) {
    fVar46 = -1.0;
    if ((pIVar11->IO).KeysDown[lVar21] == true) {
      fVar46 = 0.0;
      if (0.0 <= pfVar2[lVar21]) {
        fVar46 = pfVar2[lVar21] + fVar52;
      }
    }
    pfVar2[lVar21] = fVar46;
  }
  (GImGui->IO).WantSetMousePos = false;
  uVar34 = (pIVar12->IO).ConfigFlags;
  if (((uVar34 & 2) == 0) || (((pIVar12->IO).BackendFlags & 1) == 0)) {
    bVar28 = 0;
  }
  else if ((((0.0 < (pIVar12->IO).NavInputs[0]) || (0.0 < (pIVar12->IO).NavInputs[2])) ||
           (0.0 < (pIVar12->IO).NavInputs[1])) || (bVar28 = 1, 0.0 < (pIVar12->IO).NavInputs[3])) {
    pIVar12->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar28 = 1;
  }
  if ((uVar34 & 1) != 0) {
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[0xc]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[0xd]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[2] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[0xe]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[1] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[1]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x12] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[2]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x13] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[3]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x14] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[4]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x15] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[0]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x11] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = (pIVar12->IO).KeyCtrl;
    if (bVar14 == true) {
      (pIVar12->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar12->IO).KeyShift == true) {
      (pIVar12->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar14 == false) && ((pIVar12->IO).KeyAlt != false)) {
      (pIVar12->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar12->IO).NavInputsDownDuration;
  pfVar29 = pfVar2;
  pfVar31 = (pIVar12->IO).NavInputsDownDurationPrev;
  for (lVar21 = 0xb; lVar21 != 0; lVar21 = lVar21 + -1) {
    *(undefined8 *)pfVar31 = *(undefined8 *)pfVar29;
    pfVar29 = pfVar29 + (ulong)bVar33 * -4 + 2;
    pfVar31 = pfVar31 + (ulong)bVar33 * -4 + 2;
  }
  for (lVar21 = 0; lVar21 != 0x16; lVar21 = lVar21 + 1) {
    fVar52 = -1.0;
    if (0.0 < (pIVar12->IO).NavInputs[lVar21]) {
      fVar52 = 0.0;
      if (0.0 <= pfVar2[lVar21]) {
        fVar52 = pfVar2[lVar21] + (pIVar12->IO).DeltaTime;
      }
    }
    pfVar2[lVar21] = fVar52;
  }
  IVar25 = pIVar12->NavInitResultId;
  if ((IVar25 != 0) &&
     ((pIVar12->NavDisableHighlight != true || (pIVar12->NavInitRequestFromMove == true)))) {
    if (pIVar12->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1e8f,"void ImGui::NavUpdate()");
    }
    if (pIVar12->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar25,pIVar12->NavLayer,&pIVar12->NavInitResultRectRel);
    }
    else {
      SetNavID(IVar25,pIVar12->NavLayer);
    }
    IVar38 = (pIVar12->NavInitResultRectRel).Max;
    pIVar5 = &pIVar12->NavWindow->NavRectRel[pIVar12->NavLayer].Min;
    *pIVar5 = (pIVar12->NavInitResultRectRel).Min;
    pIVar5[1] = IVar38;
  }
  pIVar12->NavInitRequest = false;
  pIVar12->NavInitRequestFromMove = false;
  pIVar12->NavInitResultId = 0;
  pIVar12->NavJustMovedToId = 0;
  pIVar13 = GImGui;
  if (pIVar12->NavMoveRequest == true) {
    IVar25 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar25 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar13->NavDisableHighlight = false;
        pIVar13->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar27 = &GImGui->NavMoveResultLocal;
      if (IVar25 == 0) {
        pIVar27 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar25 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar25 != 0)) &&
         (IVar25 != GImGui->NavId)) {
        pIVar27 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar27 == pIVar3) {
LAB_00119e27:
        pIVar27 = pIVar3;
      }
      else if ((pIVar3->ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar52 = (GImGui->NavMoveResultOther).DistBox;
        fVar46 = pIVar27->DistBox;
        if (fVar46 <= fVar52) {
          if (((fVar52 != fVar46) || (NAN(fVar52) || NAN(fVar46))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar27->DistCenter < *pfVar2 || pIVar27->DistCenter == *pfVar2)) goto LAB_00119e2a;
        }
        goto LAB_00119e27;
      }
LAB_00119e2a:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar27->Window == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x1f93,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        IVar38 = pIVar27->Window->Pos;
        IVar37 = (pIVar27->RectRel).Min;
        IVar40 = (pIVar27->RectRel).Max;
        fVar52 = IVar38.x;
        rect_abs.Min.x = IVar37.x + fVar52;
        fVar46 = IVar38.y;
        rect_abs.Min.y = IVar37.y + fVar46;
        rect_abs.Max.x = IVar40.x + fVar52;
        rect_abs.Max.y = IVar40.y + fVar46;
        NavScrollToBringItemIntoView(pIVar27->Window,&rect_abs);
        IVar37 = CalcNextScrollFromScrollTargetAndClamp(pIVar27->Window,false);
        IVar38 = pIVar27->Window->Scroll;
        delta_scroll.y = IVar38.y - IVar37.y;
        delta_scroll.x = IVar38.x - IVar37.x;
        ImRect::Translate(&pIVar27->RectRel,&delta_scroll);
        if ((pIVar27->Window->Flags & 0x1000000) != 0) {
          local_40.Min.x = rect_abs.Min.x + delta_scroll.x;
          local_40.Min.y = rect_abs.Min.y + delta_scroll.y;
          local_40.Max.x = rect_abs.Max.x + delta_scroll.x;
          local_40.Max.y = rect_abs.Max.y + delta_scroll.y;
          NavScrollToBringItemIntoView(pIVar27->Window->ParentWindow,&local_40);
        }
      }
      ClearActiveID();
      pIVar13->NavWindow = pIVar27->Window;
      IVar25 = pIVar27->ID;
      if (pIVar13->NavId != IVar25) {
        pIVar13->NavJustMovedToId = IVar25;
        pIVar13->NavJustMovedToMultiSelectScopeId = pIVar27->SelectScopeId;
      }
      SetNavIDWithRectRel(IVar25,pIVar13->NavLayer,&pIVar27->RectRel);
      pIVar13->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar12->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar12->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1ea2,"void ImGui::NavUpdate()");
    }
    if (((pIVar12->NavMoveResultLocal).ID == 0) && ((pIVar12->NavMoveResultOther).ID == 0)) {
      pIVar12->NavDisableHighlight = false;
    }
    pIVar12->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar12->NavMousePosDirty == true) && (pIVar12->NavIdIsAlive == true)) {
    if (((((pIVar12->IO).ConfigFlags & 4) != 0) &&
        (((((pIVar12->IO).BackendFlags & 4) != 0 && (pIVar12->NavDisableHighlight == false)) &&
         (pIVar12->NavDisableMouseHover == true)))) && (pIVar12->NavWindow != (ImGuiWindow *)0x0)) {
      IVar38 = NavCalcPreferredRefPos();
      (pIVar12->IO).MousePosPrev = IVar38;
      (pIVar12->IO).MousePos = IVar38;
      (pIVar12->IO).WantSetMousePos = true;
    }
    pIVar12->NavMousePosDirty = false;
  }
  pIVar12->NavIdIsAlive = false;
  pIVar12->NavJustTabbedId = 0;
  IVar30 = pIVar12->NavLayer;
  if (ImGuiNavLayer_Menu < IVar30) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1eb8,"void ImGui::NavUpdate()");
  }
  pIVar22 = pIVar12->NavWindow;
  pIVar26 = pIVar22;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    for (; pIVar26 != (ImGuiWindow *)0x0; pIVar26 = pIVar26->ParentWindow) {
      if ((pIVar26->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar26 != pIVar22) {
          pIVar26->NavLastChildNavWindow = pIVar22;
        }
        break;
      }
    }
    if ((IVar30 == ImGuiNavLayer_Main) && (pIVar22->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar22->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar13 = GImGui;
  pIVar22 = GetFrontMostPopupModal();
  if (pIVar22 == (ImGuiWindow *)0x0) {
    if (pIVar13->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0011a0d9;
LAB_0011a0d2:
      bVar14 = false;
    }
    else {
      if (pIVar13->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0011a0d2;
      fVar52 = (pIVar13->IO).DeltaTime * -10.0 + pIVar13->NavWindowingHighlightAlpha;
      fVar52 = (float)(-(uint)(0.0 <= fVar52) & (uint)fVar52);
      pIVar13->NavWindowingHighlightAlpha = fVar52;
      if ((pIVar13->DimBgRatio <= 0.0) && (fVar52 <= 0.0)) {
        pIVar13->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
LAB_0011a0d9:
      bVar14 = IsNavInputPressed(3,ImGuiInputReadMode_Pressed);
      if (((pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar13->IO).KeyCtrl == true))
         && (bVar16 = IsKeyPressedMap(0,true), bVar16)) {
        bVar33 = (byte)(pIVar13->IO).ConfigFlags;
        uVar35 = (uint)bVar33;
        if (bVar14 || (bVar33 & 1) != 0) {
LAB_0011a11c:
          pIVar22 = pIVar13->NavWindow;
          if ((pIVar22 != (ImGuiWindow *)0x0) ||
             (pIVar22 = FindWindowNavFocusable
                                  ((pIVar13->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar22 != (ImGuiWindow *)0x0)) {
            pIVar13->NavWindowingTargetAnim = pIVar22;
            pIVar13->NavWindowingTarget = pIVar22;
            pIVar13->NavWindowingTimer = 0.0;
            pIVar13->NavWindowingHighlightAlpha = 0.0;
            pIVar13->NavWindowingToggleLayer = (bool)(~(byte)uVar35 & 1);
            pIVar13->NavInputSource = ImGuiInputSource_NavGamepad - (uVar35 & 1);
          }
        }
      }
      else if (bVar14) {
        uVar35 = 0;
        goto LAB_0011a11c;
      }
      bVar14 = pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0;
    }
    fVar52 = (pIVar13->IO).DeltaTime + pIVar13->NavWindowingTimer;
    pIVar13->NavWindowingTimer = fVar52;
    if (bVar14) {
LAB_0011a2f3:
      bVar14 = false;
      pIVar22 = (ImGuiWindow *)0x0;
    }
    else {
      IVar18 = pIVar13->NavInputSource;
      if (IVar18 != ImGuiInputSource_NavGamepad) {
LAB_0011a266:
        if (IVar18 == ImGuiInputSource_NavKeyboard) {
          fVar46 = (pIVar13->NavWindowingTimer + -0.2) / 0.05;
          fVar52 = 1.0;
          if (fVar46 <= 1.0) {
            fVar52 = fVar46;
          }
          fVar52 = (float)(~-(uint)(fVar46 < 0.0) & (uint)fVar52);
          uVar35 = -(uint)(fVar52 <= pIVar13->NavWindowingHighlightAlpha);
          pIVar13->NavWindowingHighlightAlpha =
               (float)(uVar35 & (uint)pIVar13->NavWindowingHighlightAlpha | ~uVar35 & (uint)fVar52);
          bVar14 = IsKeyPressedMap(0,true);
          if (bVar14) {
            NavUpdateWindowingHighlightWindow((pIVar13->IO).KeyShift - 1 | 1);
          }
          if ((pIVar13->IO).KeyCtrl == false) {
            pIVar22 = pIVar13->NavWindowingTarget;
            bVar14 = false;
            goto LAB_0011a2fe;
          }
        }
        goto LAB_0011a2f3;
      }
      fVar46 = (fVar52 + -0.2) / 0.05;
      fVar52 = 1.0;
      if (fVar46 <= 1.0) {
        fVar52 = fVar46;
      }
      fVar52 = (float)(~-(uint)(fVar46 < 0.0) & (uint)fVar52);
      uVar35 = -(uint)(fVar52 <= pIVar13->NavWindowingHighlightAlpha);
      pIVar13->NavWindowingHighlightAlpha =
           (float)(uVar35 & (uint)pIVar13->NavWindowingHighlightAlpha | ~uVar35 & (uint)fVar52);
      bVar14 = IsNavInputPressed(0xc,ImGuiInputReadMode_RepeatSlow);
      bVar16 = IsNavInputPressed(0xd,ImGuiInputReadMode_RepeatSlow);
      if ((uint)bVar14 - (uint)bVar16 != 0) {
        NavUpdateWindowingHighlightWindow((uint)bVar14 - (uint)bVar16);
        pIVar13->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar13->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0011a2f3;
        IVar18 = pIVar13->NavInputSource;
        goto LAB_0011a266;
      }
      pbVar32 = &pIVar13->NavWindowingToggleLayer;
      *pbVar32 = (bool)(*pbVar32 &
                       (pIVar13->NavWindowingHighlightAlpha <= 1.0 &&
                       pIVar13->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar32 == false) {
        pIVar22 = pIVar13->NavWindowingTarget;
        bVar14 = false;
      }
      else {
        bVar14 = pIVar13->NavWindow != (ImGuiWindow *)0x0;
        pIVar22 = (ImGuiWindow *)0x0;
      }
      pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_0011a2fe:
    dir_sources = 1;
    bVar16 = IsNavInputPressed(0x10,ImGuiInputReadMode_Pressed);
    if (bVar16) {
      pIVar13->NavWindowingToggleLayer = true;
    }
    if (((pIVar13->ActiveId == 0) || (pIVar13->ActiveIdAllowOverlap == true)) &&
       ((pIVar13->NavWindowingToggleLayer == true &&
        (bVar16 = IsNavInputPressed(0x10,ImGuiInputReadMode_Released), bVar16)))) {
      bVar16 = IsMousePosValid(&(pIVar13->IO).MousePos);
      bVar15 = IsMousePosValid(&(pIVar13->IO).MousePosPrev);
      bVar14 = (bool)(bVar15 == bVar16 | bVar14);
    }
    pIVar26 = pIVar13->NavWindowingTarget;
    if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 4) == 0)) {
      if (pIVar13->NavInputSource == ImGuiInputSource_NavGamepad) {
        dir_sources = 4;
LAB_0011a3fe:
        IVar38 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
      }
      else {
        IVar38.x = 0.0;
        IVar38.y = 0.0;
        if ((pIVar13->NavInputSource == ImGuiInputSource_NavKeyboard) &&
           ((pIVar13->IO).KeyShift == false)) goto LAB_0011a3fe;
      }
      fVar52 = IVar38.x;
      fVar46 = IVar38.y;
      if ((((fVar52 != 0.0) || (NAN(fVar52))) || (fVar46 != 0.0)) || (NAN(fVar46))) {
        fVar36 = (pIVar13->IO).DisplayFramebufferScale.x;
        fVar47 = (pIVar13->IO).DisplayFramebufferScale.y;
        if (fVar47 <= fVar36) {
          fVar36 = fVar47;
        }
        fVar36 = (float)(int)(fVar36 * (pIVar13->IO).DeltaTime * 800.0);
        IVar38 = pIVar26->RootWindow->Pos;
        IVar37.y = IVar38.y + fVar46 * fVar36;
        IVar37.x = IVar38.x + fVar52 * fVar36;
        pIVar26->RootWindow->Pos = IVar37;
        pIVar13->NavDisableMouseHover = true;
        MarkIniSettingsDirty(pIVar26);
      }
    }
    if (pIVar22 != (ImGuiWindow *)0x0) {
      if ((pIVar13->NavWindow == (ImGuiWindow *)0x0) || (pIVar22 != pIVar13->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar13->NavDisableHighlight = false;
        pIVar13->NavDisableMouseHover = true;
        pIVar26 = pIVar22->NavLastChildNavWindow;
        if (pIVar22->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar26 = pIVar22;
        }
        ClosePopupsOverWindow(pIVar26,false);
        FocusWindow(pIVar26);
        if (pIVar26->NavLastIds[0] == 0) {
          NavInitWindow(pIVar26,false);
        }
        if ((pIVar26->DC).NavLayerActiveMask == 2) {
          pIVar13->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar14) && (pIVar22 = pIVar13->NavWindow, pIVar26 = pIVar22, pIVar22 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar26, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar26 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar22) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar22;
        pIVar22 = pIVar13->NavWindow;
      }
      pIVar13->NavDisableHighlight = false;
      pIVar13->NavDisableMouseHover = true;
      IVar30 = ImGuiNavLayer_Main;
      if (((pIVar22->DC).NavLayerActiveMask & 2) != 0) {
        IVar30 = pIVar13->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar30);
    }
  }
  else {
    pIVar13->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar34 & 1) == 0 & (bVar28 ^ 1))) || (pIVar12->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar12->IO).NavActive = false;
LAB_0011a5c7:
    bVar14 = pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar14 = (pIVar12->NavWindow->Flags & 0x40000U) == 0;
    (pIVar12->IO).NavActive = bVar14;
    if (((!bVar14) || (pIVar12->NavId == 0)) ||
       (bVar14 = true, pIVar12->NavDisableHighlight != false)) goto LAB_0011a5c7;
  }
  (pIVar12->IO).NavVisible = bVar14;
  bVar14 = IsNavInputPressed(1,ImGuiInputReadMode_Pressed);
  if (bVar14) {
    if (pIVar12->ActiveId == 0) {
      pIVar22 = pIVar12->NavWindow;
      if (((pIVar22 == (ImGuiWindow *)0x0) || ((pIVar22->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar22->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar12->OpenPopupStack).Size < 1) {
          if (pIVar12->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x5000000U) != 0x1000000)) {
              pIVar22->NavLastIds[0] = 0;
            }
            pIVar12->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar23 = ImVector<ImGuiPopupData>::back(&pIVar12->OpenPopupStack);
          if ((pIVar23->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar12->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        if (pIVar22->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                        ,0x1ed4,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar22->ParentWindow);
        SetNavID(pIVar22->ChildId,0);
        pIVar12->NavIdIsAlive = false;
        if (pIVar12->NavDisableMouseHover == true) {
          pIVar12->NavMousePosDirty = true;
        }
      }
    }
    else if ((pIVar12->ActiveIdBlockNavInputFlags & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar12->NavActivateId = 0;
  pIVar12->NavActivateDownId = 0;
  pIVar12->NavActivatePressedId = 0;
  pIVar12->NavInputId = 0;
  if (((pIVar12->NavId == 0) || (pIVar12->NavDisableHighlight != false)) ||
     (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_0011a74b:
    pIVar22 = pIVar12->NavWindow;
    if (pIVar22 == (ImGuiWindow *)0x0) goto LAB_0011a7b4;
    if ((pIVar22->Flags & 0x40000) != 0) {
      pIVar12->NavDisableHighlight = true;
    }
    bVar14 = false;
  }
  else {
    if (pIVar12->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar12->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar14 = IsNavInputPressed(0,ImGuiInputReadMode_Pressed);
          IVar25 = pIVar12->ActiveId;
          IVar17 = pIVar12->NavId;
          if (IVar25 == 0 && bVar14) {
            pIVar12->NavActivateId = IVar17;
            pIVar12->NavActivateDownId = IVar17;
LAB_0011ab8a:
            pIVar12->NavActivatePressedId = IVar17;
          }
          else if (IVar25 == 0) {
            pIVar12->NavActivateDownId = IVar17;
            if (bVar14) goto LAB_0011ab8a;
          }
          else {
            bVar16 = IVar25 == IVar17;
            if (!bVar16) goto LAB_0011a74b;
            pIVar12->NavActivateDownId = IVar25;
            IVar17 = IVar25;
            if (bVar14 && bVar16) goto LAB_0011ab8a;
          }
LAB_0011ab92:
          bVar14 = IsNavInputPressed(2,ImGuiInputReadMode_Pressed);
          if (bVar14) {
            pIVar12->NavInputId = pIVar12->NavId;
          }
        }
        else if (pIVar12->ActiveId == pIVar12->NavId || pIVar12->ActiveId == 0) goto LAB_0011ab92;
      }
      goto LAB_0011a74b;
    }
LAB_0011a7b4:
    bVar14 = true;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  IVar25 = pIVar12->NavActivateId;
  if ((IVar25 != 0) && (pIVar12->NavActivateDownId != IVar25)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1f01,"void ImGui::NavUpdate()");
  }
  pIVar12->NavMoveRequest = false;
  IVar25 = pIVar12->NavNextActivateId;
  if (IVar25 != 0) {
    pIVar12->NavActivateId = IVar25;
    pIVar12->NavActivateDownId = IVar25;
    pIVar12->NavActivatePressedId = IVar25;
    pIVar12->NavInputId = IVar25;
  }
  pIVar12->NavNextActivateId = 0;
  if (pIVar12->ActiveId == 0) {
    uVar35 = 0xffffffff;
  }
  else {
    uVar35 = pIVar12->ActiveIdAllowNavDirFlags;
  }
  if (pIVar12->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar12->NavMoveDir = -1;
    pIVar12->NavMoveRequestFlags = 0;
    if (((!bVar14) && (uVar35 != 0 && pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar22->Flags & 0x40000) == 0)) {
      if (((uVar35 & 1) != 0) &&
         (bVar14 = IsNavInputPressedAnyOfTwo(4,0x12,ImGuiInputReadMode_Repeat), bVar14)) {
        pIVar12->NavMoveDir = 0;
      }
      if (((uVar35 & 2) != 0) &&
         (bVar14 = IsNavInputPressedAnyOfTwo(5,0x13,ImGuiInputReadMode_Repeat), bVar14)) {
        pIVar12->NavMoveDir = 1;
      }
      if (((uVar35 & 4) != 0) &&
         (bVar14 = IsNavInputPressedAnyOfTwo(6,0x14,ImGuiInputReadMode_Repeat), bVar14)) {
        pIVar12->NavMoveDir = 2;
      }
      if (((uVar35 & 8) != 0) &&
         (bVar14 = IsNavInputPressedAnyOfTwo(7,0x15,ImGuiInputReadMode_Repeat), bVar14)) {
        pIVar12->NavMoveDir = 3;
      }
    }
    pIVar12->NavMoveClipDir = pIVar12->NavMoveDir;
  }
  else {
    if ((pIVar12->NavMoveDir == -1) || (pIVar12->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1f1c,"void ImGui::NavUpdate()");
    }
    if (pIVar12->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1f1d,"void ImGui::NavUpdate()");
    }
    pIVar12->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar13 = GImGui;
  local_80 = 0.0;
  if ((((((uVar34 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar22 = GImGui->NavWindow, pIVar22 != (ImGuiWindow *)0x0)) &&
      (((pIVar22->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar14 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar16 = IsKeyDown((pIVar13->IO).KeyMap[6]);
    if (((byte)uVar35 >> 2 & bVar14) != ((byte)uVar35 >> 3 & bVar16)) {
      if (((pIVar22->DC).NavLayerActiveMask == 0) && ((pIVar22->DC).NavHasScroll == true)) {
        bVar14 = IsKeyPressed((pIVar13->IO).KeyMap[5],true);
        if (bVar14) {
          fVar52 = (pIVar22->Scroll).y;
          fVar46 = (pIVar22->DC).CursorMaxPos.y;
          fVar36 = fVar52 - ((pIVar22->InnerMainRect).Max.y - (pIVar22->InnerMainRect).Min.y);
          (pIVar22->Scroll).y = fVar36;
          fVar36 = (fVar52 + fVar46) - fVar36;
        }
        else {
          bVar14 = IsKeyPressed((pIVar13->IO).KeyMap[6],true);
          if (!bVar14) goto LAB_0011a950;
          fVar52 = (pIVar22->Scroll).y;
          fVar36 = ((pIVar22->InnerMainRect).Max.y - (pIVar22->InnerMainRect).Min.y) + fVar52;
          fVar46 = (pIVar22->DC).CursorMaxPos.y;
          (pIVar22->Scroll).y = fVar36;
          fVar36 = (fVar52 + fVar46) - fVar36;
        }
        (pIVar22->DC).CursorMaxPos.y = fVar36;
      }
      else {
        fVar52 = (pIVar22->NavRectRel[pIVar13->NavLayer].Max.y -
                 pIVar22->NavRectRel[pIVar13->NavLayer].Min.y) +
                 (((pIVar22->InnerMainRect).Max.y - (pIVar22->InnerMainRect).Min.y) -
                 GImGui->FontBaseSize * pIVar22->FontWindowScale);
        local_80 = 0.0;
        fVar52 = (float)(~-(uint)(fVar52 <= 0.0) & (uint)fVar52);
        bVar14 = IsKeyPressed((pIVar13->IO).KeyMap[5],true);
        if (bVar14) {
          pIVar13->NavMoveDir = 3;
          pIVar13->NavMoveClipDir = 2;
          pIVar13->NavMoveRequestFlags = 0x30;
          local_80 = -fVar52;
        }
        else {
          bVar14 = IsKeyPressed((pIVar13->IO).KeyMap[6],true);
          if (bVar14) {
            pIVar13->NavMoveDir = 2;
            pIVar13->NavMoveClipDir = 3;
            pIVar13->NavMoveRequestFlags = 0x30;
            local_80 = fVar52;
          }
        }
      }
    }
  }
LAB_0011a950:
  if (pIVar12->NavMoveDir == -1) {
    if ((pIVar12->NavMoveRequest & 1U) == 0) goto LAB_0011a9a3;
  }
  else {
    pIVar12->NavMoveRequest = true;
    pIVar12->NavMoveDirLast = pIVar12->NavMoveDir;
  }
  if (pIVar12->NavId == 0) {
    pIVar12->NavInitRequest = true;
    pIVar12->NavInitRequestFromMove = true;
    pIVar12->NavInitResultId = 0;
    pIVar12->NavDisableHighlight = false;
  }
LAB_0011a9a3:
  NavUpdateAnyRequestFlag();
  pIVar22 = pIVar12->NavWindow;
  if (((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x40000) == 0)) &&
     (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar52 = (float)(int)(GImGui->FontBaseSize * pIVar22->FontWindowScale * 100.0 *
                          (pIVar12->IO).DeltaTime + 0.5);
    if ((((pIVar22->DC).NavLayerActiveMask == 0) && ((pIVar22->DC).NavHasScroll == true)) &&
       (pIVar12->NavMoveRequest == true)) {
      uVar34 = pIVar12->NavMoveDir;
      if (uVar34 < 2) {
        fVar46 = (pIVar22->Scroll).x;
        fVar36 = (pIVar22->DC).CursorMaxPos.x;
        fVar47 = (float)(int)(*(float *)(&DAT_00185c98 + (ulong)(uVar34 == 0) * 4) * fVar52 + fVar46
                             );
        (pIVar22->Scroll).x = fVar47;
        (pIVar22->DC).CursorMaxPos.x = (fVar46 + fVar36) - fVar47;
      }
      else if ((uVar34 & 0xfffffffe) == 2) {
        fVar46 = (pIVar22->Scroll).y;
        fVar36 = (pIVar22->DC).CursorMaxPos.y;
        fVar47 = (float)(int)(*(float *)(&DAT_00185c98 + (ulong)(uVar34 == 2) * 4) * fVar52 + fVar46
                             );
        (pIVar22->Scroll).y = fVar47;
        (pIVar22->DC).CursorMaxPos.y = (fVar46 + fVar36) - fVar47;
      }
    }
    IVar38 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar46 = IVar38.x;
    if (((fVar46 != 0.0) || (NAN(fVar46))) && (pIVar22->ScrollbarX == true)) {
      fVar36 = (pIVar22->Scroll).x;
      fVar47 = (float)(int)(fVar46 * fVar52 + fVar36);
      fVar46 = (pIVar22->DC).CursorMaxPos.x;
      (pIVar22->Scroll).x = fVar47;
      (pIVar22->DC).CursorMaxPos.x = (fVar36 + fVar46) - fVar47;
      pIVar12->NavMoveFromClampedRefRect = true;
    }
    fVar46 = IVar38.y;
    if ((fVar46 != 0.0) || (NAN(fVar46))) {
      fVar36 = (pIVar22->Scroll).y;
      fVar46 = (float)(int)(fVar46 * fVar52 + fVar36);
      fVar52 = (pIVar22->DC).CursorMaxPos.y;
      (pIVar22->Scroll).y = fVar46;
      (pIVar22->DC).CursorMaxPos.y = (fVar36 + fVar52) - fVar46;
      pIVar12->NavMoveFromClampedRefRect = true;
    }
  }
  ImGuiNavMoveResult::Clear(&pIVar12->NavMoveResultLocal);
  ImGuiNavMoveResult::Clear(&pIVar12->NavMoveResultLocalVisibleSet);
  ImGuiNavMoveResult::Clear(&pIVar12->NavMoveResultOther);
  if (((pIVar12->NavMoveRequest == true) && (pIVar12->NavMoveFromClampedRefRect == true)) &&
     (pIVar12->NavLayer == ImGuiNavLayer_Main)) {
    pIVar22 = pIVar12->NavWindow;
    IVar38 = (pIVar22->InnerMainRect).Min;
    fVar52 = (pIVar22->Pos).x;
    fVar46 = (pIVar22->Pos).y;
    IVar37 = (pIVar22->InnerMainRect).Max;
    rect_abs.Min.x = (IVar38.x - fVar52) + -1.0;
    rect_abs.Min.y = (IVar38.y - fVar46) + -1.0;
    rect_abs.Max.x = (IVar37.x - fVar52) + 1.0;
    rect_abs.Max.y = (IVar37.y - fVar46) + 1.0;
    bVar14 = ImRect::Contains(&rect_abs,pIVar22->NavRectRel);
    if (!bVar14) {
      auVar49._0_4_ = GImGui->FontBaseSize * pIVar22->FontWindowScale * 0.5;
      auVar48._0_4_ = rect_abs.Max.x - rect_abs.Min.x;
      auVar48._4_4_ = rect_abs.Max.y - rect_abs.Min.y;
      auVar48._8_4_ = rect_abs.Max.x - rect_abs.Max.x;
      auVar48._12_4_ = rect_abs.Max.y - rect_abs.Max.y;
      auVar49._4_4_ = auVar49._0_4_;
      auVar49._8_4_ = auVar49._0_4_;
      auVar49._12_4_ = auVar49._0_4_;
      auVar49 = minps(auVar48,auVar49);
      rect_abs.Min.x = auVar49._0_4_ + rect_abs.Min.x;
      rect_abs.Min.y = auVar49._4_4_ + rect_abs.Min.y;
      rect_abs.Max.x = rect_abs.Max.x - auVar49._0_4_;
      rect_abs.Max.y = rect_abs.Max.y - auVar49._4_4_;
      ImRect::ClipWith(pIVar22->NavRectRel + pIVar12->NavLayer,&rect_abs);
      pIVar12->NavId = 0;
    }
    pIVar12->NavMoveFromClampedRefRect = false;
  }
  pIVar22 = pIVar12->NavWindow;
  if (pIVar22 == (ImGuiWindow *)0x0) {
    IVar40 = (GImGui->IO).DisplaySize;
    fVar52 = 0.0;
    fVar46 = 0.0;
  }
  else {
    IVar38 = pIVar22->NavRectRel[pIVar12->NavLayer].Min;
    IVar37 = pIVar22->NavRectRel[pIVar12->NavLayer].Max;
    fVar36 = IVar38.x;
    fVar47 = IVar38.y;
    IVar39.x = 0.0;
    IVar39.y = 0.0;
    fVar52 = 0.0;
    fVar46 = 0.0;
    if (fVar47 <= IVar37.y && fVar36 <= IVar37.x) {
      fVar52 = fVar36;
      fVar46 = fVar47;
      IVar39 = IVar37;
    }
    fVar36 = (pIVar22->Pos).x;
    fVar52 = fVar52 + fVar36;
    fVar47 = (pIVar22->Pos).y;
    fVar46 = fVar46 + fVar47;
    IVar40.x = IVar39.x + fVar36;
    IVar40.y = IVar39.y + fVar47;
  }
  (pIVar12->NavScoringRectScreen).Min.y = fVar46 + local_80;
  fVar47 = IVar40.y + local_80;
  (pIVar12->NavScoringRectScreen).Max.y = fVar47;
  fVar36 = fVar52 + 1.0;
  if (IVar40.x <= fVar52 + 1.0) {
    fVar36 = IVar40.x;
  }
  (pIVar12->NavScoringRectScreen).Min.x = fVar36;
  (pIVar12->NavScoringRectScreen).Max.x = fVar36;
  if (fVar47 < fVar46 + local_80) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1f6b,"void ImGui::NavUpdate()");
  }
  pIVar12->NavScoringCount = 0;
  pIVar12 = GImGui;
  pIVar5 = &(GImGui->IO).MousePos;
  bVar14 = IsMousePosValid(pIVar5);
  if (bVar14) {
    IVar38 = (pIVar12->IO).MousePos;
    IVar41.x = (float)(int)IVar38.x;
    IVar41.y = (float)(int)IVar38.y;
    pIVar12->LastValidMousePos = IVar41;
    (pIVar12->IO).MousePos = IVar41;
  }
  bVar14 = IsMousePosValid(pIVar5);
  if ((bVar14) && (bVar14 = IsMousePosValid(&(pIVar12->IO).MousePosPrev), bVar14)) {
    IVar38 = (pIVar12->IO).MousePos;
    IVar37 = (pIVar12->IO).MousePosPrev;
    IVar42.x = IVar38.x - IVar37.x;
    IVar42.y = IVar38.y - IVar37.y;
    (pIVar12->IO).MouseDelta = IVar42;
    if (((IVar42.x != 0.0) || ((NAN(IVar42.x) || (IVar42.y != 0.0)))) || (NAN(IVar42.y))) {
      pIVar12->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar12->IO).MouseDelta.x = 0.0;
    (pIVar12->IO).MouseDelta.y = 0.0;
  }
  (pIVar12->IO).MousePosPrev = (pIVar12->IO).MousePos;
  for (lVar21 = 0; lVar21 != 5; lVar21 = lVar21 + 1) {
    if ((pIVar12->IO).MouseDown[lVar21] == true) {
      fVar52 = (pIVar12->IO).MouseDownDuration[lVar21];
      pbVar32 = (pIVar12->IO).MouseClicked + lVar21;
      *pbVar32 = fVar52 < 0.0;
      pbVar32[10] = false;
      (pIVar12->IO).MouseDownDurationPrev[lVar21] = fVar52;
      if (0.0 <= fVar52) {
        (pIVar12->IO).MouseDownDuration[lVar21] = fVar52 + (pIVar12->IO).DeltaTime;
        (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
        bVar14 = IsMousePosValid(pIVar5);
        auVar45 = ZEXT816(0);
        if (bVar14) {
          IVar38 = (pIVar12->IO).MousePos;
          IVar37 = (pIVar12->IO).MouseClickedPos[lVar21];
          auVar45._0_4_ = IVar38.x - IVar37.x;
          auVar45._4_4_ = IVar38.y - IVar37.y;
          auVar45._8_8_ = 0;
        }
        fVar52 = (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21];
        fVar46 = auVar45._0_4_ * auVar45._0_4_ + auVar45._4_4_ * auVar45._4_4_;
        uVar34 = -(uint)(fVar46 <= fVar52);
        (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21] =
             (float)(~uVar34 & (uint)fVar46 | (uint)fVar52 & uVar34);
        IVar38 = (pIVar12->IO).MouseDragMaxDistanceAbs[lVar21];
        fVar52 = IVar38.x;
        fVar46 = IVar38.y;
        auVar50._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
        auVar50._8_4_ = auVar45._8_4_ ^ 0x80000000;
        auVar50._12_4_ = auVar45._12_4_ ^ 0x80000000;
        auVar49 = maxps(auVar50,auVar45);
        uVar34 = -(uint)(auVar49._0_4_ <= fVar52);
        uVar35 = -(uint)(auVar49._4_4_ <= fVar46);
        (pIVar12->IO).MouseDragMaxDistanceAbs[lVar21] =
             (ImVec2)(CONCAT44(~uVar35 & (uint)auVar49._4_4_,~uVar34 & (uint)auVar49._0_4_) |
                     CONCAT44((uint)fVar46 & uVar35,(uint)fVar52 & uVar34));
      }
      else {
        (pIVar12->IO).MouseDownDuration[lVar21] = 0.0;
        (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
        dVar43 = pIVar12->Time;
        if ((float)(dVar43 - (pIVar12->IO).MouseClickedTime[lVar21]) <
            (pIVar12->IO).MouseDoubleClickTime) {
          bVar14 = IsMousePosValid(pIVar5);
          fVar52 = 0.0;
          fVar46 = 0.0;
          if (bVar14) {
            IVar38 = (pIVar12->IO).MousePos;
            IVar37 = (pIVar12->IO).MouseClickedPos[lVar21];
            fVar52 = IVar38.x - IVar37.x;
            fVar46 = IVar38.y - IVar37.y;
          }
          fVar36 = (pIVar12->IO).MouseDoubleClickMaxDist;
          dVar43 = -3.4028234663852886e+38;
          if (fVar52 * fVar52 + fVar46 * fVar46 < fVar36 * fVar36) {
            (pIVar12->IO).MouseDoubleClicked[lVar21] = true;
            dVar43 = -3.4028234663852886e+38;
          }
        }
        (pIVar12->IO).MouseClickedTime[lVar21] = dVar43;
        (pIVar12->IO).MouseClickedPos[lVar21] = (pIVar12->IO).MousePos;
        (pIVar12->IO).MouseDownWasDoubleClick[lVar21] = (pIVar12->IO).MouseDoubleClicked[lVar21];
        pIVar6 = (pIVar12->IO).MouseDragMaxDistanceAbs + lVar21;
        pIVar6->x = 0.0;
        pIVar6->y = 0.0;
        (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21] = 0.0;
      }
    }
    else {
      (pIVar12->IO).MouseClicked[lVar21] = false;
      fVar52 = (pIVar12->IO).MouseDownDuration[lVar21];
      (pIVar12->IO).MouseReleased[lVar21] = 0.0 <= fVar52;
      pbVar32 = (pIVar12->IO).MouseClicked + lVar21;
      (pIVar12->IO).MouseDownDurationPrev[lVar21] = fVar52;
      (pIVar12->IO).MouseDownDuration[lVar21] = -1.0;
      (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
    }
    if (((pIVar12->IO).MouseDown[lVar21] == false) && ((pIVar12->IO).MouseReleased[lVar21] == false)
       ) {
      (pIVar12->IO).MouseDownWasDoubleClick[lVar21] = false;
    }
    if (*pbVar32 == true) {
      pIVar12->NavDisableMouseHover = false;
    }
  }
  fVar52 = (pIVar11->IO).DeltaTime;
  iVar19 = pIVar11->FramerateSecPerFrameIdx;
  pIVar11->FramerateSecPerFrameAccum =
       (fVar52 - pIVar11->FramerateSecPerFrame[iVar19]) + pIVar11->FramerateSecPerFrameAccum;
  pIVar11->FramerateSecPerFrame[iVar19] = fVar52;
  pIVar11->FramerateSecPerFrameIdx = (iVar19 + 1) % 0x78;
  uVar34 = -(uint)(0.0 < pIVar11->FramerateSecPerFrameAccum);
  (pIVar11->IO).Framerate =
       (float)(~uVar34 & 0x7f7fffff |
              (uint)(1.0 / (pIVar11->FramerateSecPerFrameAccum / 120.0)) & uVar34);
  UpdateMouseMovingWindowNewFrame();
  UpdateHoveredWindowAndCaptureFlags();
  pIVar22 = GetFrontMostPopupModal();
  if ((pIVar22 != (ImGuiWindow *)0x0) ||
     ((pIVar11->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar11->NavWindowingHighlightAlpha)))) {
    fVar52 = (pIVar11->IO).DeltaTime * 6.0 + pIVar11->DimBgRatio;
    if (1.0 <= fVar52) {
      fVar52 = 1.0;
    }
    pIVar11->DimBgRatio = fVar52;
  }
  else {
    fVar52 = (pIVar11->IO).DeltaTime * -10.0 + pIVar11->DimBgRatio;
    pIVar11->DimBgRatio = (float)(-(uint)(0.0 <= fVar52) & (uint)fVar52);
  }
  pIVar11->MouseCursor = 0;
  pIVar11->WantTextInputNextFrame = -1;
  pIVar11->WantCaptureMouseNextFrame = -1;
  pIVar11->WantCaptureKeyboardNextFrame = -1;
  (pIVar11->PlatformImePos).x = 1.0;
  pIVar12 = GImGui;
  (pIVar11->PlatformImePos).y = 1.0;
  pIVar22 = GImGui->HoveredWindow;
  if ((pIVar22 != (ImGuiWindow *)0x0) && (pIVar22->Collapsed == false)) {
    fVar52 = (GImGui->IO).MouseWheel;
    if ((fVar52 != 0.0) ||
       (((NAN(fVar52) || (fVar46 = (GImGui->IO).MouseWheelH, fVar46 != 0.0)) || (NAN(fVar46))))) {
      if ((((fVar52 == 0.0) && (!NAN(fVar52))) || ((GImGui->IO).KeyCtrl != true)) ||
         ((GImGui->IO).FontAllowUserScaling != true)) {
        do {
          if ((pIVar22->Flags & 0x1000218U) != 0x1000010) {
            if (((pIVar22->Flags & 0x210U) == 0) &&
               ((((fVar52 != 0.0 || (NAN(fVar52))) ||
                 ((fVar46 = (GImGui->IO).MouseWheelH, fVar46 != 0.0 || (NAN(fVar46))))) &&
                ((GImGui->IO).KeyCtrl == false)))) {
              fVar46 = (pIVar22->WindowPadding).x;
              fVar46 = (fVar46 + fVar46 +
                       ((pIVar22->ContentsRegionRect).Max.x - (pIVar22->ContentsRegionRect).Min.x))
                       * 0.67;
              if ((fVar52 != 0.0) || (NAN(fVar52))) {
                fVar36 = GImGui->FontBaseSize * pIVar22->FontWindowScale;
                if ((GImGui->IO).KeyShift == false) {
                  fVar47 = (pIVar22->WindowPadding).y;
                  fVar54 = (fVar47 + fVar47 +
                           ((pIVar22->ContentsRegionRect).Max.y -
                           (pIVar22->ContentsRegionRect).Min.y)) * 0.67;
                  fVar47 = fVar36 * 5.0;
                  if (fVar54 <= fVar36 * 5.0) {
                    fVar47 = fVar54;
                  }
                  fVar36 = (pIVar22->Scroll).y;
                  fVar47 = -fVar52 * (float)(int)fVar47 + fVar36;
                  fVar52 = (pIVar22->DC).CursorMaxPos.y;
                  (pIVar22->Scroll).y = fVar47;
                  (pIVar22->DC).CursorMaxPos.y = (fVar36 + fVar52) - fVar47;
                }
                else {
                  fVar47 = fVar36 + fVar36;
                  if (fVar46 <= fVar36 + fVar36) {
                    fVar47 = fVar46;
                  }
                  fVar36 = (pIVar22->Scroll).x;
                  fVar47 = -fVar52 * (float)(int)fVar47 + fVar36;
                  fVar52 = (pIVar22->DC).CursorMaxPos.x;
                  (pIVar22->Scroll).x = fVar47;
                  (pIVar22->DC).CursorMaxPos.x = (fVar36 + fVar52) - fVar47;
                }
              }
              fVar52 = (pIVar12->IO).MouseWheelH;
              if (((fVar52 != 0.0) || (NAN(fVar52))) && ((pIVar12->IO).KeyShift == false)) {
                fVar36 = pIVar12->FontBaseSize * pIVar22->FontWindowScale;
                fVar36 = fVar36 + fVar36;
                if (fVar46 <= fVar36) {
                  fVar36 = fVar46;
                }
                fVar46 = (pIVar22->Scroll).x;
                fVar47 = (pIVar22->DC).CursorMaxPos.x;
                fVar52 = fVar46 - fVar52 * (float)(int)fVar36;
                (pIVar22->Scroll).x = fVar52;
                (pIVar22->DC).CursorMaxPos.x = (fVar46 + fVar47) - fVar52;
              }
            }
            break;
          }
          pIVar22 = pIVar22->ParentWindow;
        } while (pIVar22 != (ImGuiWindow *)0x0);
      }
      else {
        fVar46 = pIVar22->FontWindowScale;
        fVar36 = fVar52 * 0.1 + fVar46;
        fVar52 = 2.5;
        if (fVar36 <= 2.5) {
          fVar52 = fVar36;
        }
        fVar52 = (float)(-(uint)(fVar36 < 0.5) & 0x3f000000 | ~-(uint)(fVar36 < 0.5) & (uint)fVar52)
        ;
        pIVar22->FontWindowScale = fVar52;
        if ((pIVar22->Flags & 0x1000000) == 0) {
          fVar52 = fVar52 / fVar46;
          fVar47 = 1.0 - fVar52;
          fVar46 = (pIVar22->Pos).x;
          fVar36 = (pIVar22->Pos).y;
          IVar38 = pIVar22->Size;
          auVar51._8_8_ = 0;
          auVar51._0_4_ = IVar38.x;
          auVar51._4_4_ = IVar38.y;
          IVar37 = (pIVar12->IO).MousePos;
          auVar53._0_4_ = (IVar37.x - fVar46) * fVar47 * IVar38.x;
          auVar53._4_4_ = (IVar37.y - fVar36) * fVar47 * IVar38.y;
          auVar53._8_4_ = fVar47 * 0.0 * 0.0;
          auVar53._12_4_ = fVar47 * 0.0 * 0.0;
          auVar49 = divps(auVar53,auVar51);
          IVar9.y = (float)(int)(auVar49._4_4_ + fVar36);
          IVar9.x = (float)(int)(auVar49._0_4_ + fVar46);
          pIVar22->Pos = IVar9;
          IVar10.y = (float)(int)(IVar38.y * fVar52);
          IVar10.x = (float)(int)(IVar38.x * fVar52);
          pIVar22->Size = IVar10;
          IVar44.x = (float)(int)(fVar52 * (pIVar22->SizeFull).x);
          IVar44.y = (float)(int)(fVar52 * (pIVar22->SizeFull).y);
          pIVar22->SizeFull = IVar44;
        }
      }
    }
  }
  pIVar22 = pIVar11->NavWindow;
  if (((pIVar22 == (ImGuiWindow *)0x0) || (pIVar22->Active != true)) ||
     (((pIVar22->Flags & 0x40000) != 0 || ((pIVar11->IO).KeyCtrl != false)))) {
    bVar14 = false;
  }
  else {
    bVar14 = IsKeyPressedMap(0,true);
  }
  pIVar11->FocusTabPressed = bVar14;
  if ((bVar14 == false) || (pIVar11->ActiveId != 0)) {
    pIVar22 = pIVar11->FocusRequestNextWindow;
  }
  else {
    pIVar22 = pIVar11->NavWindow;
    pIVar11->FocusRequestNextWindow = pIVar22;
    pIVar11->FocusRequestNextCounterAll = 0x7fffffff;
    if ((pIVar11->NavId == 0) || (pIVar11->NavIdTabCounter == 0x7fffffff)) {
      iVar19 = -(uint)(pIVar11->IO).KeyShift;
    }
    else {
      iVar19 = pIVar11->NavIdTabCounter + (-(uint)(pIVar11->IO).KeyShift | 1) + 1;
    }
    pIVar11->FocusRequestNextCounterTab = iVar19;
  }
  pIVar11->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar11->FocusRequestCurrCounterAll = 0x7fffffff;
  pIVar11->FocusRequestCurrCounterTab = 0x7fffffff;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    pIVar11->FocusRequestCurrWindow = pIVar22;
    if ((pIVar11->FocusRequestNextCounterAll != 0x7fffffff) &&
       (iVar19 = (pIVar22->DC).FocusCounterAll, iVar19 != -1)) {
      pIVar11->FocusRequestCurrCounterAll =
           (pIVar11->FocusRequestNextCounterAll + iVar19 + 1) % (iVar19 + 1);
    }
    if ((pIVar11->FocusRequestNextCounterTab != 0x7fffffff) &&
       (iVar19 = (pIVar22->DC).FocusCounterTab, iVar19 != -1)) {
      pIVar11->FocusRequestCurrCounterTab =
           (pIVar11->FocusRequestNextCounterTab + iVar19 + 1) % (iVar19 + 1);
    }
    pIVar11->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar11->FocusRequestNextCounterAll = 0x7fffffff;
    pIVar11->FocusRequestNextCounterTab = 0x7fffffff;
  }
  pIVar11->NavIdTabCounter = 0x7fffffff;
  iVar19 = (pIVar11->WindowsFocusOrder).Size;
  if (iVar19 != (pIVar11->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xe15,"void ImGui::NewFrame()");
  }
  for (i = 0; i != iVar19; i = i + 1) {
    ppIVar24 = ImVector<ImGuiWindow_*>::operator[](&pIVar11->Windows,i);
    pIVar22 = *ppIVar24;
    pIVar22->WasActive = pIVar22->Active;
    pIVar22->BeginCount = 0;
    pIVar22->Active = false;
    pIVar22->WriteAccessed = false;
    iVar19 = (pIVar11->Windows).Size;
  }
  if ((pIVar11->NavWindow != (ImGuiWindow *)0x0) && (pIVar11->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&pIVar11->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&pIVar11->BeginPopupStack,0);
  ClosePopupsOverWindow(pIVar11->NavWindow,false);
  pIVar12 = GImGui;
  (pIVar12->NextWindowData).SizeVal.x = 400.0;
  (pIVar12->NextWindowData).SizeVal.y = 400.0;
  (pIVar12->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  pIVar11->FrameScopePushedImplicitWindow = true;
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT((g.IO.DeltaTime > 0.0f || g.FrameCount == 0)              && "Need a positive DeltaTime!");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value!");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting!");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!");
    IM_ASSERT(g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && "Invalid style setting.");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check: required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Perform simple check: the beta io.ConfigWindowsResizeFromEdges option requires back-end to honor mouse cursor changes and set the ImGuiBackendFlags_HasMouseCursors flag accordingly.
    if (g.IO.ConfigWindowsResizeFromEdges && !(g.IO.BackendFlags & ImGuiBackendFlags_HasMouseCursors))
        g.IO.ConfigWindowsResizeFromEdges = false;

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameScopeActive = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();
    g.BackgroundDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();
    g.ForegroundDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEdited = g.ActiveIdHasBeenEdited;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();
    UpdateHoveredWindowAndCaptureFlags();

    // Background darkening/whitening
    if (GetFrontMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.FrameScopePushedImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}